

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_andnot(roaring64_bitmap_t *r1,roaring64_bitmap_t *r2)

{
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  void *c2;
  container_t *pcVar3;
  byte type1;
  leaf_t *result_leaf_1;
  leaf_t *leaf2;
  leaf_t *leaf1;
  leaf_t *result_leaf;
  int compare_result;
  _Bool it2_present;
  art_iterator_t it2;
  art_iterator_t it1;
  roaring64_bitmap_t *result;
  undefined7 in_stack_fffffffffffffea8;
  uint8_t in_stack_fffffffffffffeaf;
  leaf_t *in_stack_fffffffffffffeb0;
  uint8_t *in_stack_fffffffffffffeb8;
  art_t *in_stack_fffffffffffffec0;
  int local_130;
  container_t *in_stack_fffffffffffffed8;
  uint8_t *local_120;
  art_t *local_98;
  
  prVar2 = roaring64_bitmap_create();
  art_init_iterator(in_stack_fffffffffffffec0,SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  art_init_iterator(in_stack_fffffffffffffec0,SUB81((ulong)in_stack_fffffffffffffeb8 >> 0x38,0));
  while (local_98 != (art_t *)0x0) {
    type1 = local_120 != (uint8_t *)0x0;
    local_130 = 0;
    if (((bool)type1) &&
       (local_130 = compare_high48((art_key_chunk_t *)in_stack_fffffffffffffeb0,
                                   (art_key_chunk_t *)
                                   CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)),
       local_130 == 0)) {
      c2 = roaring_malloc(0x1114c1);
      in_stack_fffffffffffffeb8 = local_120;
      in_stack_fffffffffffffec0 = local_98;
      pcVar3 = container_andnot(in_stack_fffffffffffffed8,type1,c2,
                                (uint8_t)((ulong)local_98 >> 0x38),local_120);
      *(container_t **)((long)c2 + 8) = pcVar3;
      _Var1 = container_nonzero_cardinality
                        ((container_t *)
                         CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),'\0');
      if (_Var1) {
        art_insert(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                   &in_stack_fffffffffffffeb0->_pad);
      }
      else {
        container_free(in_stack_fffffffffffffeb0,in_stack_fffffffffffffeaf);
        free_leaf((leaf_t *)0x111579);
      }
      art_iterator_next((art_iterator_t *)0x111586);
      art_iterator_next((art_iterator_t *)0x111590);
    }
    if (((type1 & 1) == 0) || (local_130 < 0)) {
      in_stack_fffffffffffffeb0 = copy_leaf_container(in_stack_fffffffffffffeb0);
      art_insert(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                 &in_stack_fffffffffffffeb0->_pad);
      art_iterator_next((art_iterator_t *)0x1115d9);
    }
    else if (0 < local_130) {
      art_iterator_next((art_iterator_t *)0x1115ec);
    }
  }
  return prVar2;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_andnot(const roaring64_bitmap_t *r1,
                                            const roaring64_bitmap_t *r2) {
    roaring64_bitmap_t *result = roaring64_bitmap_create();

    art_iterator_t it1 = art_init_iterator(&r1->art, /*first=*/true);
    art_iterator_t it2 = art_init_iterator(&r2->art, /*first=*/true);

    while (it1.value != NULL) {
        // Cases:
        // 1. it1_present && !it2_present -> output it1, it1++
        // 2. it1_present && it2_present
        //    a. it1 <  it2 -> output it1, it1++
        //    b. it1 == it2 -> output it1 - it2, it1++, it2++
        //    c. it1 >  it2 -> it2++
        bool it2_present = it2.value != NULL;
        int compare_result = 0;
        if (it2_present) {
            compare_result = compare_high48(it1.key, it2.key);
            if (compare_result == 0) {
                // Case 2b: iterators at the same high key position.
                leaf_t *result_leaf = (leaf_t *)roaring_malloc(sizeof(leaf_t));
                leaf_t *leaf1 = (leaf_t *)it1.value;
                leaf_t *leaf2 = (leaf_t *)it2.value;
                result_leaf->container = container_andnot(
                    leaf1->container, leaf1->typecode, leaf2->container,
                    leaf2->typecode, &result_leaf->typecode);

                if (container_nonzero_cardinality(result_leaf->container,
                                                  result_leaf->typecode)) {
                    art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
                } else {
                    container_free(result_leaf->container,
                                   result_leaf->typecode);
                    free_leaf(result_leaf);
                }
                art_iterator_next(&it1);
                art_iterator_next(&it2);
            }
        }
        if (!it2_present || compare_result < 0) {
            // Cases 1 and 2a: it1 is the only iterator or is before it2.
            leaf_t *result_leaf = copy_leaf_container((leaf_t *)it1.value);
            art_insert(&result->art, it1.key, (art_val_t *)result_leaf);
            art_iterator_next(&it1);
        } else if (compare_result > 0) {
            // Case 2c: it1 is after it2.
            art_iterator_next(&it2);
        }
    }
    return result;
}